

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::createAccessMemberNode(Parser *this,Token *t,Node *container,Node *key)

{
  long in_RCX;
  long in_RDX;
  CompilationContext *in_RDI;
  Node *n;
  Node *in_stack_ffffffffffffffc0;
  Node *local_8;
  
  if ((in_RDX == 0) || (in_RCX == 0)) {
    local_8 = (Node *)0x0;
  }
  else {
    local_8 = (Node *)operator_new(0x30);
    Node::Node(in_stack_ffffffffffffffc0,in_RDI,(Token *)local_8);
    *(undefined4 *)&local_8->nodeType = 0x15;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
               (value_type *)in_RDI);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
               (value_type *)in_RDI);
  }
  return local_8;
}

Assistant:

Node * createAccessMemberNode(Token & t, Node * container, Node * key)
  {
    if (!container || !key)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_MEMBER;
    n->children.push_back(container);
    n->children.push_back(key);
    return n;
  }